

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O2

int expr_donew(expr *expr,int ac,t_atom *av)

{
  long *plVar1;
  ex_ex **ppeVar2;
  size_t sVar3;
  int iVar4;
  _binbuf *x;
  char *pcVar5;
  ex_ex *peVar6;
  ex_ex *eptr;
  anon_union_8_5_735de1bb_for_ex_cont *paVar7;
  long lVar8;
  long lVar9;
  size_t sVar10;
  int exp_strlen;
  char *exp_string;
  
  paVar7 = (anon_union_8_5_735de1bb_for_ex_cont *)0x0;
  memset(expr->exp_var,0,0x960);
  x = binbuf_new();
  binbuf_add(x,ac,av);
  binbuf_gettext(x,&exp_string,&exp_strlen);
  binbuf_free(x);
  pcVar5 = (char *)resizebytes(exp_string,(long)exp_strlen,(long)exp_strlen + 1);
  pcVar5[exp_strlen] = '\0';
  expr->exp_string = pcVar5;
  expr->exp_str = pcVar5;
  expr->exp_nexpr = 0;
  exp_string = pcVar5;
  while( true ) {
    lVar8 = 10;
    if ((paVar7 != (anon_union_8_5_735de1bb_for_ex_cont *)0x0) && (*pcVar5 == '\0')) {
      paVar7[2].v_vec = (t_float *)nullex.ex_end;
      lVar8 = nullex.ex_type;
      *paVar7 = nullex.ex_cont;
      paVar7[1].v_int = lVar8;
      iVar4 = 0;
      goto LAB_00188864;
    }
    peVar6 = (ex_ex *)malloc(0xf0);
    if (peVar6 == (ex_ex *)0x0) break;
    lVar9 = 0;
    eptr = peVar6;
    sVar3 = 0;
    do {
      sVar10 = sVar3;
      if (lVar8 <= lVar9) {
        lVar8 = lVar8 + 10;
        eptr = (ex_ex *)realloc(eptr,lVar8 * 0x18);
        if (eptr == (ex_ex *)0x0) goto LAB_0018881d;
        peVar6 = (ex_ex *)((long)&eptr->ex_cont + sVar10);
      }
      iVar4 = getoken(expr,peVar6);
      if (iVar4 != 0) {
        free(eptr);
        goto LAB_00188818;
      }
      lVar9 = lVar9 + 1;
      plVar1 = &peVar6->ex_type;
      peVar6 = peVar6 + 1;
      sVar3 = sVar10 + 0x18;
    } while (*plVar1 != 0);
    if (eptr == (ex_ex *)0x0) {
LAB_00188818:
      eptr = (ex_ex *)0x0;
LAB_0018882e:
      for (lVar8 = 0; lVar8 < expr->exp_nexpr; lVar8 = lVar8 + 1) {
        free(expr->exp_stack[lVar8]);
        expr->exp_stack[lVar8] = (ex_ex *)0x0;
      }
      expr->exp_nexpr = 0;
      free(eptr);
      iVar4 = 1;
LAB_00188864:
      freebytes(exp_string,(long)exp_strlen + 1);
      return iVar4;
    }
    peVar6 = (ex_ex *)malloc(sVar10 + 0x18);
    iVar4 = expr->exp_nexpr;
    expr->exp_stack[iVar4] = peVar6;
    if (peVar6 == (ex_ex *)0x0) {
      pd_error(expr,"expr: malloc for expr nodes failed\n");
      goto LAB_0018882e;
    }
    *(undefined8 *)((long)&peVar6->ex_type + sVar10) = 0;
    expr->exp_nexpr = iVar4 + 1;
    peVar6 = ex_match(eptr,0);
    if (100 < (long)expr->exp_nexpr) {
      pd_error(expr,"expr: too many variables (maximum %d allowed)",100);
      goto LAB_0018882e;
    }
    if (peVar6 == (ex_ex *)0x0) goto LAB_0018882e;
    paVar7 = &ex_parse(expr,eptr,expr->exp_stack[(long)expr->exp_nexpr + -1],(long *)0x0)->ex_cont;
    if (paVar7 == (anon_union_8_5_735de1bb_for_ex_cont *)0x0) goto LAB_0018882e;
    peVar6 = expr->exp_stack[(long)expr->exp_nexpr + -1];
    ppeVar2 = &peVar6->ex_end;
    for (; (peVar6->ex_type != 0 && (peVar6 != *ppeVar2)); peVar6 = peVar6 + 1) {
      if (((peVar6->ex_type == 3) && ((peVar6->ex_cont).v_int == 0x3001c)) &&
         ((0x15 < (ulong)peVar6[1].ex_type || ((0x202020UL >> (peVar6[1].ex_type & 0x3fU) & 1) == 0)
          ))) {
        post("Bad left value: ");
        ex_print(peVar6);
        goto LAB_0018882e;
      }
    }
    free(eptr);
    pcVar5 = expr->exp_str;
  }
LAB_0018881d:
  eptr = (ex_ex *)0x0;
  post("ex_lex: no mem\n");
  goto LAB_0018882e;
}

Assistant:

int
expr_donew(struct expr *expr, int ac, t_atom *av)
{
        struct ex_ex *list;
        struct ex_ex *ret;
        long max_node = 0;              /* maximum number of nodes needed */
        char *exp_string;
        int exp_strlen;
        t_binbuf *b;
        int i;

        memset(expr->exp_var, 0, MAX_VARS * sizeof (*expr->exp_var));
#ifdef PD
        b = binbuf_new();
        binbuf_add(b, ac, av);
        binbuf_gettext(b, &exp_string, &exp_strlen);
        binbuf_free(b);
#else /* MSP */
 {
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[250];
    t_atom *ap;
    int indx;

    for (ap = av, indx = 0; indx < ac; indx++, ap = ++av) {
        int newlength;

        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ')
                        length--;
        atom_string(ap, string, 250);
        newlength = length + strlen(string) + 1;
        if (!(newbuf = t_resizebytes(buf, length, newlength)))
                                break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI)
                        buf[length-1] = '\n';
        else
                        buf[length-1] = ' ';
    }

    if (length && buf[length-1] == ' ') {
        if (newbuf = t_resizebytes(buf, length, length-1))
        {
            buf = newbuf;
            length--;
        }
    }
    exp_string = buf;
    exp_strlen  = length;
 }
#endif
        exp_string = (char *)t_resizebytes(exp_string, exp_strlen,exp_strlen+1);
        exp_string[exp_strlen] = 0;
        expr->exp_string = exp_string;
        expr->exp_str = exp_string;
        expr->exp_nexpr = 0;
        ret = (struct ex_ex *) 0;
        /*
         * if ret == 0 it means that we have no expression
         * so we let the pass go through to build a single null stack
         */
        while (*expr->exp_str || !ret) {
                list = ex_lex(expr, &max_node);
                if (!list) {            /* syntax error */
                        goto error;
                }
                expr->exp_stack[expr->exp_nexpr] =
                  (struct ex_ex *)fts_malloc(max_node * sizeof (struct ex_ex));
                                if (!expr->exp_stack[expr->exp_nexpr]) {
                                        post_error( (fts_object_t *) expr,
                                                "expr: malloc for expr nodes failed\n");
                                        goto error;
                                }
                                expr->exp_stack[expr->exp_nexpr][max_node-1].ex_type=0;
                expr->exp_nexpr++;
                ret = ex_match(list, (long)0);
                if (expr->exp_nexpr  > MAX_VARS)
                    /* we cannot exceed MAX_VARS '$' variables */
                {
                        post_error((fts_object_t *) expr,
                            "expr: too many variables (maximum %d allowed)",
                                MAX_VARS);
                        goto error;
                }
                if (!ret)               /* syntax error */
                        goto error;
                ret = ex_parse(expr,
                        list, expr->exp_stack[expr->exp_nexpr - 1], (long *)0);
                if (!ret || ex_checklval(expr->exp_stack[expr->exp_nexpr - 1]))
                        goto error;
                fts_free(list);
        }
        *ret = nullex;
        t_freebytes(exp_string, exp_strlen+1);
        return (0);
error:
        for (i = 0; i < expr->exp_nexpr; i++) {
                fts_free(expr->exp_stack[i]);
                expr->exp_stack[i] = 0;
        }
        expr->exp_nexpr = 0;
        if (list)
                fts_free(list);
        t_freebytes(exp_string, exp_strlen+1);
        return (1);
}